

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O2

void __thiscall jaegertracing::net::URI_testAuthority_Test::TestBody(URI_testAuthority_Test *this)

{
  char *pcVar1;
  allocator local_e1;
  AssertionResult gtest_ar;
  string local_d0;
  string local_b0 [32];
  string local_90 [136];
  
  std::__cxx11::string::string(local_b0,"http://localhost",&local_e1);
  jaegertracing::net::URI::parse(local_90);
  URI::authority_abi_cxx11_(&local_d0,(URI *)local_90);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"localhost\"","URI::parse(\"http://localhost\").authority()",
             (char (*) [10])0x1e9ae6,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  URI::~URI((URI *)local_90);
  std::__cxx11::string::~string(local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x24,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::__cxx11::string::string(local_b0,"http://localhost:80",&local_e1);
    jaegertracing::net::URI::parse(local_90);
    URI::authority_abi_cxx11_(&local_d0,(URI *)local_90);
    testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
              ((internal *)&gtest_ar,"\"localhost:80\"",
               "URI::parse(\"http://localhost:80\").authority()",(char (*) [13])0x1e9b1f,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    URI::~URI((URI *)local_90);
    std::__cxx11::string::~string(local_b0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)local_90);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                 ,0x25,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_90);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(URI, testAuthority)
{
    ASSERT_EQ("localhost", URI::parse("http://localhost").authority());
    ASSERT_EQ("localhost:80", URI::parse("http://localhost:80").authority());
}